

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginComboPopup(ImGuiID popup_id,ImRect *bb,ImGuiComboFlags flags)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  uint in_EDX;
  ImRect *in_RSI;
  float fVar3;
  bool ret;
  ImGuiWindowFlags window_flags;
  ImVec2 pos;
  ImRect r_outer;
  ImVec2 size_expected;
  ImGuiWindow *popup_window;
  char name [16];
  ImRect *in_stack_00000060;
  ImGuiDir *in_stack_00000068;
  int popup_max_height_in_items;
  float w;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000364;
  bool *in_stack_00000368;
  char *in_stack_00000370;
  ImRect *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar4;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  ImGuiPopupFlags in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  ImGuiWindow *in_stack_ffffffffffffff88;
  ImVec2 in_stack_ffffffffffffff90;
  ImRect in_stack_ffffffffffffff98;
  char local_48 [16];
  ImVec2 local_38;
  ImVec2 local_30;
  int local_28;
  float local_24;
  ImGuiContext *local_20;
  uint local_14;
  ImRect *local_10;
  bool local_1;
  
  local_20 = GImGui;
  local_14 = in_EDX;
  local_10 = in_RSI;
  bVar1 = IsPopupOpen((ImGuiID)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  if (bVar1) {
    local_24 = ImRect::GetWidth(local_10);
    if (((local_20->NextWindowData).Flags & 0x10U) == 0) {
      if ((local_14 & 0x1e) == 0) {
        local_14 = local_14 | 4;
      }
      local_28 = -1;
      if ((local_14 & 4) == 0) {
        if ((local_14 & 2) == 0) {
          if ((local_14 & 8) != 0) {
            local_28 = 0x14;
          }
        }
        else {
          local_28 = 4;
        }
      }
      else {
        local_28 = 8;
      }
      ImVec2::ImVec2(&local_30,local_24,0.0);
      fVar3 = CalcMaxPopupHeightFromItemCount(local_28);
      ImVec2::ImVec2(&local_38,3.4028235e+38,fVar3);
      SetNextWindowSizeConstraints
                ((ImVec2 *)in_stack_ffffffffffffff90,(ImVec2 *)in_stack_ffffffffffffff88,
                 (ImGuiSizeCallback)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    else {
      fVar3 = ImMax<float>((local_20->NextWindowData).SizeConstraintRect.Min.x,local_24);
      (local_20->NextWindowData).SizeConstraintRect.Min.x = fVar3;
    }
    ImFormatString(local_48,0x10,"##Combo_%02d",(ulong)(uint)(local_20->BeginPopupStack).Size);
    pIVar2 = FindWindowByName((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
    ;
    if ((pIVar2 != (ImGuiWindow *)0x0) && ((pIVar2->WasActive & 1U) != 0)) {
      CalcWindowNextAutoFitSize(in_stack_ffffffffffffff88);
      bVar1 = (local_14 & 1) == 0;
      pIVar2->AutoPosLastDirection = (uint)bVar1 + (uint)bVar1 * 2;
      in_stack_ffffffffffffff98 =
           GetPopupAllowedExtentRect((ImGuiWindow *)in_stack_ffffffffffffff90);
      ImRect::GetBL(in_stack_ffffffffffffff68);
      FindBestWindowPosForPopupEx
                ((ImVec2 *)g,_popup_max_height_in_items,in_stack_00000068,in_stack_00000060,
                 (ImRect *)name._8_8_,name._4_4_);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,0.0,0.0);
      SetNextWindowPos((ImVec2 *)&stack0xffffffffffffff90,0,(ImVec2 *)&stack0xffffffffffffff80);
    }
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff74,(local_20->Style).FramePadding.x,
                   (local_20->Style).WindowPadding.y);
    PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffff98.Max.y,
                 (ImVec2 *)in_stack_ffffffffffffff98.Min);
    bVar1 = Begin(in_stack_00000370,in_stack_00000368,in_stack_00000364);
    uVar4 = (uint)bVar1 << 0x18;
    PopStyleVar((int)in_stack_ffffffffffffff84);
    if ((uVar4 & 0x1000000) == 0) {
      EndPopup();
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    ImGuiNextWindowData::ClearFlags(&local_20->NextWindowData);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginComboPopup(ImGuiID popup_id, const ImRect& bb, ImGuiComboFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (!IsPopupOpen(popup_id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags();
        return false;
    }

    // Set popup size
    float w = bb.GetWidth();
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)); // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    // This is essentially a specialized version of BeginPopupEx()
    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Set position given a custom constraint (peak into expected window size so we can position it)
    // FIXME: This might be easier to express with an hypothetical SetNextWindowPosConstraints() function?
    // FIXME: This might be moved to Begin() or at least around the same spot where Tooltips and other Popups are calling FindBestWindowPosForPopupEx()?
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            // Always override 'AutoPosLastDirection' to not leave a chance for a past value to affect us.
            ImVec2 size_expected = CalcWindowNextAutoFitSize(popup_window);
            popup_window->AutoPosLastDirection = (flags & ImGuiComboFlags_PopupAlignLeft) ? ImGuiDir_Left : ImGuiDir_Down; // Left = "Below, Toward Left", Down = "Below, Toward Right (default)"
            ImRect r_outer = GetPopupAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(g.Style.FramePadding.x, g.Style.WindowPadding.y)); // Horizontally align ourselves with the framed text
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}